

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcHashEntryPpDefine::~CTcHashEntryPpDefine(CTcHashEntryPpDefine *this)

{
  char **__ptr;
  CVmHashTable *this_00;
  long lVar1;
  
  (this->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CTcHashEntryPpDefine_00316810;
  if ((this->super_CTcHashEntryPp).argv_ != (char **)0x0) {
    for (lVar1 = 0; __ptr = (this->super_CTcHashEntryPp).argv_,
        lVar1 < (this->super_CTcHashEntryPp).argc_; lVar1 = lVar1 + 1) {
      lib_free_str(__ptr[lVar1]);
    }
    free(__ptr);
    free((this->super_CTcHashEntryPp).arg_entry_);
    this_00 = (this->super_CTcHashEntryPp).params_table_;
    if (this_00 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(this_00);
    }
    operator_delete(this_00,0x20);
  }
  lib_free_str(this->expan_);
  if (this->orig_expan_ != this->expan_) {
    lib_free_str(this->orig_expan_);
  }
  CVmHashEntry::~CVmHashEntry((CVmHashEntry *)this);
  return;
}

Assistant:

CTcHashEntryPpDefine::~CTcHashEntryPpDefine()
{
    int i;
    
    /* delete the argument list */
    if (argv_ != 0)
    {
        /* delete each argument string */
        for (i = 0 ; i < argc_ ; ++i)
            lib_free_str(argv_[i]);

        /* delete the argument vector */
        t3free(argv_);

        /* delete the argument entry list */
        t3free(arg_entry_);

        /* delete the hash table */
        delete params_table_;
    }

    /* delete the expansion */
    lib_free_str(expan_);
    if (orig_expan_ != expan_)
        lib_free_str(orig_expan_);
}